

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  bool bVar1;
  byte bVar2;
  stbi_uc sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  int *in_RSI;
  stbi_uc *in_RDI;
  long in_R8;
  int ext;
  int len;
  stbi_uc *o;
  stbi__int32 h;
  stbi__int32 w;
  stbi__int32 y;
  stbi__int32 x;
  int tag;
  int pcount;
  int pi;
  int first_frame;
  int dispose;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  stbi__gif *in_stack_ffffffffffffff80;
  stbi__context *in_stack_ffffffffffffff88;
  uint uVar10;
  int local_3c;
  int local_34;
  stbi_uc *local_8;
  
  bVar1 = false;
  if (*(long *)(in_RSI + 2) == 0) {
    iVar4 = stbi__gif_header(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0)
    ;
    if (iVar4 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar4 = stbi__mad3sizes_valid
                      ((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                       in_stack_ffffffffffffff78);
    if (iVar4 == 0) {
      stbi__err("too large");
      return (stbi_uc *)0x0;
    }
    iVar4 = *in_RSI * in_RSI[1];
    pvVar9 = stbi__malloc(0x799b4a);
    *(void **)(in_RSI + 2) = pvVar9;
    pvVar9 = stbi__malloc(0x799b65);
    *(void **)(in_RSI + 4) = pvVar9;
    pvVar9 = stbi__malloc(0x799b7b);
    *(void **)(in_RSI + 6) = pvVar9;
    if (((*(long *)(in_RSI + 2) == 0) || (*(long *)(in_RSI + 4) == 0)) ||
       (*(long *)(in_RSI + 6) == 0)) {
      stbi__err("outofmem");
      return (stbi_uc *)0x0;
    }
    memset(*(void **)(in_RSI + 2),0,(long)(iVar4 * 4));
    memset(*(void **)(in_RSI + 4),0,(long)(iVar4 * 4));
    memset(*(void **)(in_RSI + 6),0,(long)iVar4);
    bVar1 = true;
  }
  else {
    local_34 = (int)(in_RSI[0xc] & 0x1cU) >> 2;
    iVar4 = *in_RSI;
    iVar6 = in_RSI[1];
    if ((local_34 == 3) && (in_R8 == 0)) {
      local_34 = 2;
    }
    if (local_34 == 3) {
      for (local_3c = 0; local_3c < iVar4 * iVar6; local_3c = local_3c + 1) {
        if (*(char *)(*(long *)(in_RSI + 6) + (long)local_3c) != '\0') {
          *(undefined4 *)(*(long *)(in_RSI + 2) + (long)(local_3c << 2)) =
               *(undefined4 *)(in_R8 + (local_3c << 2));
        }
      }
    }
    else if (local_34 == 2) {
      for (local_3c = 0; local_3c < iVar4 * iVar6; local_3c = local_3c + 1) {
        if (*(char *)(*(long *)(in_RSI + 6) + (long)local_3c) != '\0') {
          *(undefined4 *)(*(long *)(in_RSI + 2) + (long)(local_3c << 2)) =
               *(undefined4 *)(*(long *)(in_RSI + 4) + (long)(local_3c << 2));
        }
      }
    }
    memcpy(*(void **)(in_RSI + 4),*(void **)(in_RSI + 2),(long)(*in_RSI * 4 * in_RSI[1]));
  }
  memset(*(void **)(in_RSI + 6),0,(long)(*in_RSI * in_RSI[1]));
  do {
    while( true ) {
      bVar2 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      uVar5 = (uint)bVar2;
      if (uVar5 != 0x21) {
        if (uVar5 == 0x2c) {
          uVar10 = uVar5;
          iVar4 = stbi__get16le((stbi__context *)in_stack_ffffffffffffff80);
          iVar6 = stbi__get16le((stbi__context *)in_stack_ffffffffffffff80);
          iVar7 = stbi__get16le((stbi__context *)in_stack_ffffffffffffff80);
          iVar8 = stbi__get16le((stbi__context *)in_stack_ffffffffffffff80);
          if ((*in_RSI < iVar4 + iVar7) || (in_RSI[1] < iVar6 + iVar8)) {
            stbi__err("bad Image Descriptor");
            local_8 = (stbi_uc *)0x0;
          }
          else {
            in_RSI[0x2219] = *in_RSI << 2;
            in_RSI[0x2213] = iVar4 << 2;
            in_RSI[0x2214] = iVar6 * in_RSI[0x2219];
            in_RSI[0x2215] = in_RSI[0x2213] + iVar7 * 4;
            in_RSI[0x2216] = in_RSI[0x2214] + iVar8 * in_RSI[0x2219];
            in_RSI[0x2217] = in_RSI[0x2213];
            in_RSI[0x2218] = in_RSI[0x2214];
            if (iVar7 == 0) {
              in_RSI[0x2218] = in_RSI[0x2216];
            }
            bVar2 = stbi__get8((stbi__context *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
            in_RSI[0x2212] = (uint)bVar2;
            if ((in_RSI[0x2212] & 0x40U) == 0) {
              in_RSI[0x2211] = in_RSI[0x2219];
              in_RSI[0x2210] = 0;
            }
            else {
              in_RSI[0x2211] = in_RSI[0x2219] << 3;
              in_RSI[0x2210] = 3;
            }
            if ((in_RSI[0x2212] & 0x80U) == 0) {
              if ((in_RSI[8] & 0x80U) == 0) {
                stbi__err("missing color table");
                return (stbi_uc *)0x0;
              }
              *(int **)(in_RSI + 0x220e) = in_RSI + 0xd;
            }
            else {
              stbi__gif_parse_colortable
                        ((stbi__context *)CONCAT44(uVar5,2 << ((byte)in_RSI[0x2212] & 7)),
                         (stbi_uc (*) [4])(in_RSI + 0x10d),(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
              ;
              *(int **)(in_RSI + 0x220e) = in_RSI + 0x10d;
            }
            local_8 = stbi__process_gif_raster
                                ((stbi__context *)CONCAT44(uVar10,iVar4),
                                 (stbi__gif *)CONCAT44(iVar6,iVar7));
            if (local_8 == (stbi_uc *)0x0) {
              local_8 = (stbi_uc *)0x0;
            }
            else {
              iVar4 = *in_RSI;
              iVar6 = in_RSI[1];
              if ((bVar1) && (0 < in_RSI[9])) {
                for (local_3c = 0; local_3c < iVar4 * iVar6; local_3c = local_3c + 1) {
                  if (*(char *)(*(long *)(in_RSI + 6) + (long)local_3c) == '\0') {
                    *(undefined1 *)((long)in_RSI + (long)in_RSI[9] * 4 + 0x37) = 0xff;
                    *(int *)(*(long *)(in_RSI + 2) + (long)(local_3c << 2)) =
                         in_RSI[(long)in_RSI[9] + 0xd];
                  }
                }
              }
            }
          }
        }
        else {
          local_8 = in_RDI;
          if (uVar5 != 0x3b) {
            stbi__err("unknown code");
            local_8 = (stbi_uc *)0x0;
          }
        }
        return local_8;
      }
      sVar3 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (sVar3 == 0xf9) break;
LAB_0079a261:
      while (sVar3 = stbi__get8((stbi__context *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
            sVar3 != '\0') {
        stbi__skip((stbi__context *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
    }
    sVar3 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (sVar3 == '\x04') {
      bVar2 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      in_RSI[0xc] = (uint)bVar2;
      iVar4 = stbi__get16le((stbi__context *)in_stack_ffffffffffffff80);
      in_RSI[0x221a] = iVar4 * 10;
      if (-1 < in_RSI[0xb]) {
        *(undefined1 *)((long)in_RSI + (long)in_RSI[0xb] * 4 + 0x37) = 0xff;
      }
      if ((in_RSI[0xc] & 1U) == 0) {
        stbi__skip((stbi__context *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_RSI[0xb] = -1;
      }
      else {
        bVar2 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_RSI[0xb] = (uint)bVar2;
        if (-1 < in_RSI[0xb]) {
          *(undefined1 *)((long)in_RSI + (long)in_RSI[0xb] * 4 + 0x37) = 0;
        }
      }
      goto LAB_0079a261;
    }
    stbi__skip((stbi__context *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  } while( true );
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}